

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NgammaT.cpp
# Opt level: O2

void __thiscall OpenMD::NgammaT::scaleSimBox(NgammaT *this)

{
  double dVar1;
  Mat3x3d scaleMat;
  Mat3x3d hmat;
  SquareMatrix<double,_3> SStack_f8;
  RectMatrix<double,_3U,_3U> local_b0;
  RectMatrix<double,_3U,_3U> local_68;
  
  SquareMatrix<double,_3>::SquareMatrix(&SStack_f8);
  dVar1 = exp((this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.dt *
              *(double *)
               ((long)(this->eta).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                      data_ + (ulong)this->axis1_ * 0x20));
  *(double *)((long)SStack_f8.super_RectMatrix<double,_3U,_3U>.data_ + (ulong)this->axis1_ * 0x20) =
       dVar1;
  dVar1 = exp((this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.dt *
              *(double *)
               ((long)(this->eta).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                      data_ + (ulong)this->axis2_ * 0x20));
  *(double *)((long)SStack_f8.super_RectMatrix<double,_3U,_3U>.data_ + (ulong)this->axis2_ * 0x20) =
       dVar1;
  dVar1 = exp((this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.dt *
              *(double *)
               ((long)(this->eta).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                      data_ + (ulong)this->axis_ * 0x20));
  *(double *)((long)SStack_f8.super_RectMatrix<double,_3U,_3U>.data_ + (ulong)this->axis_ * 0x20) =
       dVar1;
  Snapshot::getHmat((Mat3x3d *)&local_68,
                    (this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.snap);
  operator*((SquareMatrix3<double> *)&local_b0,(SquareMatrix3<double> *)&local_68,
            (SquareMatrix3<double> *)&SStack_f8);
  RectMatrix<double,_3U,_3U>::operator=(&local_68,&local_b0);
  Snapshot::setHmat((this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.snap,
                    (Mat3x3d *)&local_68);
  return;
}

Assistant:

void NgammaT::scaleSimBox() {
    Mat3x3d scaleMat;

    scaleMat(axis1_, axis1_) = exp(dt * eta(axis1_, axis1_));
    scaleMat(axis2_, axis2_) = exp(dt * eta(axis2_, axis2_));
    scaleMat(axis_, axis_)   = exp(dt * eta(axis_, axis_));
    Mat3x3d hmat             = snap->getHmat();
    hmat                     = hmat * scaleMat;
    snap->setHmat(hmat);
  }